

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::resize_bilinear_c2
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  float fVar5;
  void *pvVar6;
  int iVar7;
  short *rows0_old;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  int iVar11;
  int dx;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int dx_1;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  short *local_120;
  Mat rowsbuf0;
  Mat rowsbuf1;
  
  uVar19 = (h + w) * 2;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (int)uVar19) {
    uVar17 = (ulong)uVar19 * 4;
  }
  pvVar8 = operator_new__(uVar17);
  lVar10 = (long)w;
  uVar17 = 0;
  if (0 < w) {
    uVar17 = (ulong)(uint)w;
  }
  lVar1 = (long)h * 4 + lVar10 * 4;
  for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
    fVar5 = ((float)(int)uVar16 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
    fVar21 = floorf(fVar5);
    iVar7 = (int)fVar21;
    fVar24 = 0.0;
    bVar18 = -1 < iVar7;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (bVar18) {
      fVar24 = (fVar5 - (float)(int)fVar21) * 2048.0;
    }
    if (srcw + -1 <= iVar7) {
      fVar24 = 2048.0;
      iVar7 = srcw + -2;
    }
    *(int *)((long)pvVar8 + uVar16 * 4) = iVar7 * 2;
    uVar19 = -(uint)(0.0 <= 2048.0 - fVar24);
    auVar22._0_4_ = (int)((float)(uVar19 & 0x3f000000 | ~uVar19 & 0xbf000000) + (2048.0 - fVar24));
    auVar22._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000) +
              fVar24);
    auVar22._8_8_ = 0;
    auVar22 = packssdw(auVar22,auVar22);
    *(int *)((long)pvVar8 + uVar16 * 4 + lVar1) = auVar22._0_4_;
  }
  uVar19 = h;
  if (h < 1) {
    uVar19 = 0;
  }
  local_120 = (short *)((long)pvVar8 + (long)h * 4 + lVar10 * 8);
  for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
    fVar5 = ((float)(int)uVar16 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
    fVar21 = floorf(fVar5);
    iVar7 = (int)fVar21;
    fVar24 = 0.0;
    bVar18 = -1 < iVar7;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (bVar18) {
      fVar24 = (fVar5 - (float)(int)fVar21) * 2048.0;
    }
    iVar4 = iVar7;
    if (srch + -1 <= iVar7) {
      iVar4 = srch + -2;
    }
    *(int *)((long)pvVar8 + uVar16 * 4 + lVar10 * 4) = iVar4;
    if (srch + -1 <= iVar7) {
      fVar24 = 2048.0;
    }
    uVar20 = -(uint)(0.0 <= 2048.0 - fVar24);
    auVar23._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar24));
    auVar23._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000) +
              fVar24);
    auVar23._8_8_ = 0;
    auVar22 = packssdw(auVar23,auVar23);
    *(int *)(local_120 + uVar16 * 2) = auVar22._0_4_;
  }
  iVar7 = w * 2 + 2;
  Mat::Mat(&rowsbuf0,iVar7,2,(Allocator *)0x0);
  Mat::Mat(&rowsbuf1,iVar7,2,(Allocator *)0x0);
  iVar7 = -2;
  for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
    iVar4 = *(int *)((long)pvVar8 + uVar16 * 4 + lVar10 * 4);
    pvVar9 = rowsbuf0.data;
    pvVar6 = rowsbuf1.data;
    if (iVar4 != iVar7) {
      if (iVar4 == iVar7 + 1) {
        iVar7 = (iVar4 + 1) * srcstride;
        for (uVar12 = 0; pvVar9 = rowsbuf1.data, pvVar6 = rowsbuf0.data, uVar17 != uVar12;
            uVar12 = uVar12 + 1) {
          lVar13 = (long)*(int *)((long)pvVar8 + uVar12 * 4);
          iVar11 = (int)*(short *)((long)pvVar8 + uVar12 * 4 + lVar1);
          iVar14 = (int)*(short *)((long)pvVar8 + uVar12 * 4 + lVar1 + 2);
          *(short *)((long)rowsbuf0.data + uVar12 * 4) =
               (short)((uint)src[lVar13 + (long)iVar7 + 2] * iVar14 +
                       (uint)src[lVar13 + iVar7] * iVar11 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 4 + 2) =
               (short)((uint)src[lVar13 + (long)iVar7 + 3] * iVar14 +
                       (uint)src[lVar13 + (long)iVar7 + 1] * iVar11 >> 4);
        }
      }
      else {
        iVar7 = iVar4 * srcstride;
        iVar11 = (iVar4 + 1) * srcstride;
        for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 1) {
          lVar13 = (long)*(int *)((long)pvVar8 + uVar12 * 4);
          iVar15 = (int)*(short *)((long)pvVar8 + uVar12 * 4 + lVar1);
          iVar14 = (int)*(short *)((long)pvVar8 + uVar12 * 4 + lVar1 + 2);
          *(short *)((long)rowsbuf0.data + uVar12 * 4) =
               (short)((uint)src[lVar13 + (long)iVar7 + 2] * iVar14 +
                       (uint)src[lVar13 + iVar7] * iVar15 >> 4);
          *(short *)((long)rowsbuf0.data + uVar12 * 4 + 2) =
               (short)((uint)src[lVar13 + (long)iVar7 + 3] * iVar14 +
                       (uint)src[lVar13 + (long)iVar7 + 1] * iVar15 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 4) =
               (short)((uint)src[lVar13 + (long)iVar11 + 2] * iVar14 +
                       (uint)src[lVar13 + iVar11] * iVar15 >> 4);
          *(short *)((long)rowsbuf1.data + uVar12 * 4 + 2) =
               (short)((uint)src[lVar13 + (long)iVar11 + 3] * iVar14 +
                       (uint)src[lVar13 + (long)iVar11 + 1] * iVar15 >> 4);
        }
      }
    }
    rowsbuf1.data = pvVar6;
    sVar2 = *local_120;
    sVar3 = local_120[1];
    for (lVar13 = 0; w * 2 != (int)lVar13; lVar13 = lVar13 + 1) {
      dst[lVar13] = (uchar)(((uint)((int)*(short *)((long)pvVar9 + lVar13 * 2) * (int)sVar2) >> 0x10
                            ) + ((uint)((int)*(short *)((long)rowsbuf1.data + lVar13 * 2) *
                                       (int)sVar3) >> 0x10) + 2 >> 2);
    }
    local_120 = local_120 + 2;
    dst = dst + stride;
    rowsbuf0.data = pvVar9;
    iVar7 = iVar4;
  }
  operator_delete__(pvVar8);
  Mat::~Mat(&rowsbuf1);
  Mat::~Mat(&rowsbuf0);
  return;
}

Assistant:

void resize_bilinear_c2(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS=11;
    const int INTER_RESIZE_COEF_SCALE=1 << INTER_RESIZE_COEF_BITS;
//     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    short* ialpha = (short*)(buf + w + h);//new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w);//new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx*2;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 =        fx  * INTER_RESIZE_COEF_SCALE;

        ialpha[dx*2    ] = SATURATE_CAST_SHORT(a0);
        ialpha[dx*2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 =        fy  * INTER_RESIZE_COEF_SCALE;

        ibeta[dy*2    ] = SATURATE_CAST_SHORT(b0);
        ibeta[dy*2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w*2+2, (size_t)2u);
    Mat rowsbuf1(w*2+2, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0a1XX = vld1_s16(ialphap);
                int16x4_t _a0a0a1a1 = vzip_s16(_a0a1XX, _a0a1XX).val[0];
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x4_t _S1ma0a1 = vmull_s16(_S1lowhigh, _a0a0a1a1);
                int32x2_t _rows1low = vadd_s32(vget_low_s32(_S1ma0a1), vget_high_s32(_S1ma0a1));
                int32x4_t _rows1 = vcombine_s32(_rows1low, vget_high_s32(_S1ma0a1));
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                rows1p[0] = (S1p[0]*a0 + S1p[2]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[3]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char *S0 = src + srcstride * (sy);
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p+1, _S0, 1);
                _S0 = vld1_lane_u8(S0p+2, _S0, 2);
                _S0 = vld1_lane_u8(S0p+3, _S0, 3);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0lowhigh = vget_low_s16(_S016);
                int16x4_t _S1lowhigh = vget_low_s16(_S116);
                int32x2x2_t _S0S1low_S0S1high = vtrn_s32(vreinterpret_s32_s16(_S0lowhigh), vreinterpret_s32_s16(_S1lowhigh));
                int32x4_t _rows01 = vmull_s16(vreinterpret_s16_s32(_S0S1low_S0S1high.val[0]), _a0);
                _rows01 = vmlal_s16(_rows01, vreinterpret_s16_s32(_S0S1low_S0S1high.val[1]), _a1);
                int16x4_t _rows01_sr4 = vshrn_n_s32(_rows01, 4);
                int16x4_t _rows1_sr4 = vext_s16(_rows01_sr4, _rows01_sr4, 2);
                vst1_s16(rows0p, _rows01_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0]*a0 + S0p[2]*a1) >> 4;
                rows0p[1] = (S0p[1]*a0 + S0p[3]*a1) >> 4;
                rows1p[0] = (S1p[0]*a0 + S1p[2]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[3]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 2;
                rows1p += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 2) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 2) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn>0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p+4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p+4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "vdup.s16   d16, %8         \n"
            "mov        r4, #2          \n"
            "vdup.s16   d17, %9         \n"
            "vdup.s32   q12, r4         \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "0:                         \n"
            "vmull.s16  q0, d2, d16     \n"
            "vmull.s16  q1, d3, d16     \n"
            "vorr.s32   q10, q12, q12   \n"
            "vorr.s32   q11, q12, q12   \n"
            "vmull.s16  q2, d6, d17     \n"
            "vmull.s16  q3, d7, d17     \n"
            "vsra.s32   q10, q0, #16    \n"
            "vsra.s32   q11, q1, #16    \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "vsra.s32   q10, q2, #16    \n"
            "vsra.s32   q11, q3, #16    \n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "vshrn.s32  d20, q10, #2    \n"
            "vshrn.s32  d21, q11, #2    \n"
            "vqmovun.s16 d20, q10        \n"
            "vst1.8     {d20}, [%2]!    \n"
            "subs       %3, #1          \n"
            "bne        0b              \n"
            "sub        %0, #16         \n"
            "sub        %1, #16         \n"
            : "=r"(rows0p), // %0
              "=r"(rows1p), // %1
              "=r"(Dp),     // %2
              "=r"(nn)      // %3
            : "0"(rows0p),
              "1"(rows1p),
              "2"(Dp),
              "3"(nn),
              "r"(b0),      // %8
              "r"(b1)       // %9
            : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(( (short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2)>>2);
        }

        ibeta += 2;
    }

    delete[] buf;
}